

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O2

bool __thiscall QCompleter::eventFilter(QCompleter *this,QObject *o,QEvent *e)

{
  QPointer<QWidget> *this_00;
  short sVar1;
  QCompleterPrivate *this_01;
  Data *pDVar2;
  QAbstractItemView *this_02;
  QModelIndex index;
  QModelIndex index_00;
  undefined1 uVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  QObject *pQVar9;
  long lVar10;
  QCompletionModel *pQVar11;
  long in_FS_OFFSET;
  undefined4 uVar12;
  undefined4 uVar13;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tVar14;
  undefined8 local_98;
  undefined8 uStack_90;
  QAbstractItemModel *pQStack_88;
  QArrayDataPointer<QModelIndex> local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QCompleterPrivate **)&this->field_0x8;
  pDVar2 = (this_01->widget).wp.d;
  if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
    pQVar9 = (QObject *)0x0;
  }
  else {
    pQVar9 = (this_01->widget).wp.value;
  }
  if (pQVar9 == o) {
    if (*(short *)(e + 8) == 0x12) {
      if ((QWidget *)this_01->popup != (QWidget *)0x0) {
        QWidget::hide((QWidget *)this_01->popup);
      }
      goto LAB_005d4343;
    }
    if ((*(short *)(e + 8) != 9) || (this_01->eatFocusOut != true)) goto LAB_005d4343;
    this_01->hiddenBecauseNoMatch = false;
    if ((this_01->popup == (QAbstractItemView *)0x0) ||
       (bVar4 = true,
       (((this_01->popup->super_QAbstractScrollArea).super_QFrame.super_QWidget.data)->
        widget_attributes & 0x8000) == 0)) goto LAB_005d4343;
    goto LAB_005d486e;
  }
LAB_005d4343:
  this_02 = (QAbstractItemView *)this_01->popup;
  if (this_02 != (QAbstractItemView *)o) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      uVar3 = QObject::eventFilter(&this->super_QObject,(QEvent *)o);
      return (bool)uVar3;
    }
    goto LAB_005d48ee;
  }
  sVar1 = *(short *)(e + 8);
  if (sVar1 == 2) {
    if ((*(byte *)(*(long *)(this_02 + 0x20) + 8) & 2) != 0) goto LAB_005d4517;
    cVar5 = QGuiApplicationPrivate::maybeForwardEventToVirtualKeyboard(e);
    bVar4 = true;
    if (cVar5 == '\0') {
      QWidget::hide((QWidget *)this_01->popup);
    }
  }
  else if (sVar1 == 3) {
    QGuiApplicationPrivate::maybeForwardEventToVirtualKeyboard(e);
    bVar4 = true;
  }
  else {
    this_00 = &this_01->widget;
    if ((sVar1 == 0x53) || (sVar1 == 0x33)) {
      bVar4 = QPointer::operator_cast_to_bool((QPointer *)this_00);
      if (bVar4) {
        pDVar2 = (this_00->wp).d;
        if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
          pQVar9 = (QObject *)0x0;
        }
        else {
          pQVar9 = (this_01->widget).wp.value;
        }
        QCoreApplication::sendEvent(pQVar9,e);
      }
    }
    else if (sVar1 == 6) {
      local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QAbstractItemView::currentIndex((QModelIndex *)&local_58,this_02);
      local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
      QAbstractItemView::selectionModel((QAbstractItemView *)this_01->popup);
      QItemSelectionModel::selectedIndexes();
      iVar6 = *(int *)(e + 0x40);
      uVar8 = iVar6 + 0xfefffff0;
      if (uVar8 < 8) {
        if ((3U >> (uVar8 & 0x1f) & 1) != 0) {
          uVar8 = QKeyEvent::modifiers();
          uVar8 = uVar8 >> 0x1a;
joined_r0x005d45d8:
          if ((uVar8 & 1) == 0) goto LAB_005d45de;
LAB_005d47a0:
          bVar4 = false;
          goto LAB_005d4861;
        }
        if ((0x28U >> (uVar8 & 0x1f) & 1) == 0) {
          uVar8 = 0xc0 >> (uVar8 & 0x1f);
          goto joined_r0x005d45d8;
        }
        iVar7 = (int)local_58;
        if (((((undefined1 *)local_78.size != (undefined1 *)0x0) || ((int)local_58 < 0)) ||
            ((long)local_58 < 0)) ||
           ((local_48.ptr == (QAbstractItemModel *)0x0 ||
            (this_01->mode != UnfilteredPopupCompletion)))) {
          if (iVar6 != 0x1000013) {
            if (iVar6 != 0x1000015) goto LAB_005d45de;
            if ((((int)local_58 < 0) || ((long)local_58 < 0)) ||
               (local_48.ptr == (QAbstractItemModel *)0x0)) {
              pQVar11 = this_01->proxy;
              iVar6 = this_01->column;
              lVar10 = *(long *)pQVar11;
              iVar7 = 0;
              goto LAB_005d483f;
            }
            local_98 = (undefined1 *)0xffffffffffffffff;
            uStack_90 = (undefined1 *)0x0;
            pQStack_88 = (QAbstractItemModel *)0x0;
            iVar6 = (**(code **)(*(long *)this_01->proxy + 0x78))();
            if (iVar7 == iVar6 + -1) {
              cVar5 = this_01->wrap;
              goto joined_r0x005d48bb;
            }
            goto LAB_005d47a0;
          }
          if ((((int)local_58 < 0) || ((long)local_58 < 0)) ||
             (local_48.ptr == (QAbstractItemModel *)0x0)) {
            local_98 = (undefined1 *)0xffffffffffffffff;
            uStack_90 = (undefined1 *)0x0;
            pQStack_88 = (QAbstractItemModel *)0x0;
            iVar7 = (**(code **)(*(long *)this_01->proxy + 0x78))(this_01->proxy,&local_98);
            pQVar11 = this_01->proxy;
            iVar6 = this_01->column;
            iVar7 = iVar7 + -1;
            lVar10 = *(long *)pQVar11;
LAB_005d483f:
            pQStack_88 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
            uStack_90 = &DAT_aaaaaaaaaaaaaaaa;
            local_98 = &DAT_aaaaaaaaaaaaaaaa;
            (**(code **)(lVar10 + 0x60))(&local_98,pQVar11,iVar7,iVar6);
            iVar6 = (int)local_98;
            iVar7 = local_98._4_4_;
            uVar12 = (undefined4)uStack_90;
            uVar13 = uStack_90._4_4_;
            tVar14.ptr = pQStack_88;
            goto LAB_005d484f;
          }
          if ((int)local_58 != 0) goto LAB_005d47a0;
          cVar5 = this_01->wrap;
joined_r0x005d48bb:
          bVar4 = true;
          if (cVar5 == '\x01') {
            bVar4 = true;
            QCompleterPrivate::setCurrentIndex
                      (this_01,(QModelIndex)ZEXT824(0xffffffffffffffff),true);
          }
          goto LAB_005d4861;
        }
        iVar6 = (int)local_58;
        iVar7 = local_58._4_4_;
        uVar12 = (undefined4)uStack_50;
        uVar13 = uStack_50._4_4_;
        tVar14.ptr = local_48.ptr;
LAB_005d484f:
        index_00.c = iVar7;
        index_00.r = iVar6;
        index_00.i._0_4_ = uVar12;
        index_00.i._4_4_ = uVar13;
        index_00.m.ptr = tVar14.ptr;
        QCompleterPrivate::setCurrentIndex(this_01,index_00,true);
LAB_005d485e:
        bVar4 = true;
      }
      else {
LAB_005d45de:
        bVar4 = QPointer::operator_cast_to_bool((QPointer *)this_00);
        if (bVar4) {
          this_01->eatFocusOut = false;
          pQVar9 = (this_01->widget).wp.value;
          (**(code **)(*(long *)pQVar9 + 0x28))(pQVar9,e);
          this_01->eatFocusOut = true;
        }
        bVar4 = QPointer::operator_cast_to_bool((QPointer *)this_00);
        if (((!bVar4) || (e[0xc] != (QEvent)0x0)) ||
           ((((this_01->popup->super_QAbstractScrollArea).super_QFrame.super_QWidget.data)->
             widget_attributes & 0x8000) == 0)) {
          bVar4 = QPointer::operator_cast_to_bool((QPointer *)this_00);
          if ((bVar4) && (bVar4 = QWidget::hasFocus((QWidget *)(this_01->widget).wp.value), !bVar4))
          {
            QWidget::hide((QWidget *)this_01->popup);
          }
          bVar4 = true;
          if (e[0xc] != (QEvent)0x0) goto LAB_005d4861;
        }
        cVar5 = QKeyEvent::matches((StandardKey)e);
        if (cVar5 != '\0') {
          QWidget::hide((QWidget *)this_01->popup);
          goto LAB_005d485e;
        }
        bVar4 = true;
        if (iVar6 + 0xfefffffcU < 2) {
LAB_005d4719:
          QWidget::hide((QWidget *)this_01->popup);
          if (((-1 < (int)local_58) && (-1 < (long)local_58)) &&
             (local_48.ptr != (QAbstractItemModel *)0x0)) {
            index.i._0_4_ = (int)uStack_50;
            index._0_8_ = local_58;
            index.i._4_4_ = (int)((ulong)uStack_50 >> 0x20);
            index.m.ptr = local_48.ptr;
            QCompleterPrivate::_q_complete(this_01,index,false);
          }
        }
        else if (iVar6 == 0x1000033) {
          uVar8 = QKeyEvent::modifiers();
          if ((uVar8 >> 0x1b & 1) != 0) goto LAB_005d48a3;
        }
        else if (iVar6 == 0x1000002) {
LAB_005d48a3:
          QWidget::hide((QWidget *)this_01->popup);
        }
        else if (iVar6 == 0x1000001) goto LAB_005d4719;
      }
LAB_005d4861:
      QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_78);
      goto LAB_005d486e;
    }
LAB_005d4517:
    bVar4 = false;
  }
LAB_005d486e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
LAB_005d48ee:
  __stack_chk_fail();
}

Assistant:

bool QCompleter::eventFilter(QObject *o, QEvent *e)
{
    Q_D(QCompleter);

    if (o == d->widget) {
        switch (e->type()) {
        case QEvent::FocusOut:
            if (d->eatFocusOut) {
                d->hiddenBecauseNoMatch = false;
                if (d->popup && d->popup->isVisible())
                    return true;
            }
            break;
        case QEvent::Hide:
            if (d->popup)
                d->popup->hide();
            break;
        default:
            break;
        }
    }

    if (o != d->popup)
        return QObject::eventFilter(o, e);

    Q_ASSERT(d->popup);
    switch (e->type()) {
    case QEvent::KeyPress: {
        QKeyEvent *ke = static_cast<QKeyEvent *>(e);

        QModelIndex curIndex = d->popup->currentIndex();
        QModelIndexList selList = d->popup->selectionModel()->selectedIndexes();

        const int key = ke->key();
        // In UnFilteredPopup mode, select the current item
        if ((key == Qt::Key_Up || key == Qt::Key_Down) && selList.isEmpty() && curIndex.isValid()
            && d->mode == QCompleter::UnfilteredPopupCompletion) {
              d->setCurrentIndex(curIndex);
              return true;
        }

        // Handle popup navigation keys. These are hardcoded because up/down might make the
        // widget do something else (lineedit cursor moves to home/end on mac, for instance)
        switch (key) {
        case Qt::Key_End:
        case Qt::Key_Home:
            if (ke->modifiers() & Qt::ControlModifier)
                return false;
            break;

        case Qt::Key_Up:
            if (!curIndex.isValid()) {
                int rowCount = d->proxy->rowCount();
                QModelIndex lastIndex = d->proxy->index(rowCount - 1, d->column);
                d->setCurrentIndex(lastIndex);
                return true;
            } else if (curIndex.row() == 0) {
                if (d->wrap)
                    d->setCurrentIndex(QModelIndex());
                return true;
            }
            return false;

        case Qt::Key_Down:
            if (!curIndex.isValid()) {
                QModelIndex firstIndex = d->proxy->index(0, d->column);
                d->setCurrentIndex(firstIndex);
                return true;
            } else if (curIndex.row() == d->proxy->rowCount() - 1) {
                if (d->wrap)
                    d->setCurrentIndex(QModelIndex());
                return true;
            }
            return false;

        case Qt::Key_PageUp:
        case Qt::Key_PageDown:
            return false;
        }

        if (d->widget) {
            // Send the event to the widget. If the widget accepted the event, do nothing
            // If the widget did not accept the event, provide a default implementation
            d->eatFocusOut = false;
            (static_cast<QObject *>(d->widget))->event(ke);
            d->eatFocusOut = true;
        }
        if (!d->widget || e->isAccepted() || !d->popup->isVisible()) {
            // widget lost focus, hide the popup
            if (d->widget && (!d->widget->hasFocus()
#ifdef QT_KEYPAD_NAVIGATION
                || (QApplicationPrivate::keypadNavigationEnabled() && !d->widget->hasEditFocus())
#endif
                ))
                d->popup->hide();
            if (e->isAccepted())
                return true;
        }

        // default implementation for keys not handled by the widget when popup is open
#if QT_CONFIG(shortcut)
        if (ke->matches(QKeySequence::Cancel)) {
            d->popup->hide();
            return true;
        }
#endif
        switch (key) {
#ifdef QT_KEYPAD_NAVIGATION
        case Qt::Key_Select:
            if (!QApplicationPrivate::keypadNavigationEnabled())
                break;
#endif
        case Qt::Key_Return:
        case Qt::Key_Enter:
        case Qt::Key_Tab:
            d->popup->hide();
            if (curIndex.isValid())
                d->_q_complete(curIndex);
            break;

        case Qt::Key_F4:
            if (ke->modifiers() & Qt::AltModifier)
                d->popup->hide();
            break;

        case Qt::Key_Backtab:
            d->popup->hide();
            break;

        default:
            break;
        }

        return true;
    }

#ifdef QT_KEYPAD_NAVIGATION
    case QEvent::KeyRelease: {
        if (d->widget &&
            QApplicationPrivate::keypadNavigationEnabled() && ke->key() == Qt::Key_Back) {
            QKeyEvent *ke = static_cast<QKeyEvent *>(e);
            // Send the event to the 'widget'. This is what we did for KeyPress, so we need
            // to do the same for KeyRelease, in case the widget's KeyPress event set
            // up something (such as a timer) that is relying on also receiving the
            // key release. I see this as a bug in Qt, and should really set it up for all
            // the affected keys. However, it is difficult to tell how this will affect
            // existing code, and I can't test for every combination!
            d->eatFocusOut = false;
            static_cast<QObject *>(d->widget)->event(ke);
            d->eatFocusOut = true;
        }
        break;
    }
#endif

    case QEvent::MouseButtonPress: {
#ifdef QT_KEYPAD_NAVIGATION
        if (d->widget
            && QApplicationPrivate::keypadNavigationEnabled()) {
            // if we've clicked in the widget (or its descendant), let it handle the click
            QWidget *source = qobject_cast<QWidget *>(o);
            if (source) {
                QPoint pos = source->mapToGlobal((static_cast<QMouseEvent *>(e))->pos());
                QWidget *target = QApplication::widgetAt(pos);
                if (target && (d->widget->isAncestorOf(target) ||
                    target == d->widget)) {
                    d->eatFocusOut = false;
                    static_cast<QObject *>(target)->event(e);
                    d->eatFocusOut = true;
                    return true;
                }
            }
        }
#endif
        if (!d->popup->underMouse()) {
            if (!QGuiApplicationPrivate::maybeForwardEventToVirtualKeyboard(e))
                d->popup->hide();
            return true;
        }
        }
        return false;

    case QEvent::MouseButtonRelease:
        QGuiApplicationPrivate::maybeForwardEventToVirtualKeyboard(e);
        return true;
    case QEvent::InputMethod:
    case QEvent::ShortcutOverride:
        if (d->widget)
            QCoreApplication::sendEvent(d->widget, e);
        break;

    default:
        return false;
    }
    return false;
}